

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS580314BA.cpp
# Opt level: O0

void * MS580314BAThread(void *pParam)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  double dVar4;
  double local_8d0;
  interval local_8c8;
  double local_8b0;
  interval local_8a8;
  interval local_890;
  char local_878 [8];
  char szTemp [256];
  char szSaveFilePath [256];
  int local_670;
  int i;
  int errcount;
  int threadperiod;
  CHRONO chrono_period;
  undefined1 local_618 [4];
  BOOL bConnected;
  CHRONO chrono_filter;
  double filteredpressure;
  double pressure_prev;
  double pressure;
  timeval tv;
  MS580314BA ms580314ba;
  void *pParam_local;
  
  pressure_prev = 0.0;
  filteredpressure = 0.0;
  chrono_filter.Suspended = 0;
  chrono_filter._68_4_ = 0;
  chrono_period._68_4_ = 0;
  i = 100;
  local_670 = 0;
  ms580314ba.WaterDensity = (double)pParam;
  memset(&tv.tv_usec,0,0x598);
  StartChrono((CHRONO *)local_618);
  StartChrono((CHRONO *)&errcount);
  do {
    while( true ) {
      StopChronoQuick((CHRONO *)&errcount);
      StartChrono((CHRONO *)&errcount);
      mSleep((long)i);
      if (bPauseMS580314BA == 0) break;
      if (chrono_period._68_4_ != 0) {
        printf("MS580314BA Paused.\n");
        chrono_period._68_4_ = 0;
        DisconnectMS580314BA((MS580314BA *)&tv.tv_usec);
      }
      if (bExit != 0) goto LAB_001cbb35;
      mSleep(100);
    }
    if (bRestartMS580314BA != 0) {
      if (chrono_period._68_4_ != 0) {
        printf("Restarting a MS580314BA.\n");
        chrono_period._68_4_ = 0;
        DisconnectMS580314BA((MS580314BA *)&tv.tv_usec);
      }
      bRestartMS580314BA = 0;
    }
    if (chrono_period._68_4_ == 0) {
      iVar1 = ConnectMS580314BA((MS580314BA *)&tv.tv_usec,"MS580314BA0.txt");
      if (iVar1 == 0) {
        chrono_period._68_4_ = 1;
        i = ms580314ba.BaudRate;
        StopChronoQuick((CHRONO *)local_618);
        StartChrono((CHRONO *)local_618);
        if (ms580314ba.Ca[9] != 0.0) {
          fclose((FILE *)ms580314ba.Ca[9]);
          ms580314ba.Ca[9] = 0.0;
        }
        if ((ms580314ba.timeout != 0) && (ms580314ba.Ca[9] == 0.0)) {
          sVar2 = strlen((char *)&ms580314ba.LastPressure);
          if (sVar2 == 0) {
            sprintf(local_878,"ms580314ba");
          }
          else {
            sprintf(local_878,"%.127s",&ms580314ba.LastPressure);
          }
          sVar2 = strlen(local_878);
          szSaveFilePath._252_4_ = (undefined4)sVar2;
          do {
            szSaveFilePath._252_4_ = szSaveFilePath._252_4_ + -1;
            if ((int)szSaveFilePath._252_4_ < 0) break;
          } while (local_878[(int)szSaveFilePath._252_4_] != '.');
          if ((0 < (int)szSaveFilePath._252_4_) &&
             (sVar2 = strlen(local_878), (int)szSaveFilePath._252_4_ < (int)sVar2)) {
            sVar2 = strlen(local_878);
            memset(local_878 + (int)szSaveFilePath._252_4_,0,
                   sVar2 - (long)(int)szSaveFilePath._252_4_);
          }
          EnterCriticalSection(&strtimeCS);
          pcVar3 = strtimeex_fns();
          sprintf(szTemp + 0xf8,"log/%.127s_%.64s.csv",local_878,pcVar3);
          LeaveCriticalSection(&strtimeCS);
          ms580314ba.Ca[9] = (double)fopen(szTemp + 0xf8,"w");
          if ((FILE *)ms580314ba.Ca[9] == (FILE *)0x0) {
            printf("Unable to create MS580314BA data file.\n");
            goto LAB_001cbb35;
          }
          fprintf((FILE *)ms580314ba.Ca[9],"tv_sec;tv_usec;pressure;\n");
          fflush((FILE *)ms580314ba.Ca[9]);
        }
      }
      else {
        chrono_period._68_4_ = 0;
        mSleep(1000);
      }
    }
    else {
      iVar1 = GetPressureMS580314BA((MS580314BA *)&tv.tv_usec,&pressure_prev);
      if (iVar1 == 0) {
        iVar1 = gettimeofday((timeval *)&pressure,(__timezone_ptr_t)0x0);
        if (iVar1 != 0) {
          pressure = 0.0;
          tv.tv_sec = 0;
        }
        EnterCriticalSection(&StateVariablesCS);
        pressure_mes = pressure_prev;
        dVar4 = GetTimeElapsedChronoQuick((CHRONO *)local_618);
        if ((2.0 < dVar4) && (dVar4 = GetTimeElapsedChronoQuick((CHRONO *)local_618), dVar4 <= 3.0))
        {
          filteredpressure = pressure_prev;
        }
        dVar4 = GetTimeElapsedChronoQuick((CHRONO *)local_618);
        if (dVar4 <= 3.0) {
          chrono_filter._64_8_ = pressure_prev;
        }
        else {
          chrono_filter._64_8_ = filteredpressure;
          if (ABS(pressure_prev - filteredpressure) < 0.05) {
            filteredpressure = pressure_prev;
            chrono_filter._64_8_ = filteredpressure;
          }
        }
        local_8b0 = Pressure2Height((double)chrono_filter._64_8_,(double)ms580314ba._1408_8_,
                                    ms580314ba.PressureRef);
        interval::interval(&local_8a8,&local_8b0);
        local_8d0 = -z_pressure_acc;
        interval::interval(&local_8c8,&local_8d0,&z_pressure_acc);
        operator+(&local_890,&local_8a8,&local_8c8);
        interval::operator=((interval *)&z_pressure,&local_890);
        LeaveCriticalSection(&StateVariablesCS);
        if (ms580314ba.timeout != 0) {
          fprintf((FILE *)ms580314ba.Ca[9],"%d;%d;%f;\n",pressure_prev,(ulong)pressure & 0xffffffff,
                  tv.tv_sec & 0xffffffff);
          fflush((FILE *)ms580314ba.Ca[9]);
        }
      }
      else {
        printf("Connection to a MS580314BA lost.\n");
        chrono_period._68_4_ = 0;
        DisconnectMS580314BA((MS580314BA *)&tv.tv_usec);
      }
    }
    if (((chrono_period._68_4_ == 0) && (local_670 = local_670 + 1, 0 < ExitOnErrorCount)) &&
       (ExitOnErrorCount <= local_670)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001cbb35:
      StopChronoQuick((CHRONO *)&errcount);
      StopChronoQuick((CHRONO *)local_618);
      if (ms580314ba.Ca[9] != 0.0) {
        fclose((FILE *)ms580314ba.Ca[9]);
        ms580314ba.Ca[9] = 0.0;
      }
      if (chrono_period._68_4_ != 0) {
        DisconnectMS580314BA((MS580314BA *)&tv.tv_usec);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE MS580314BAThread(void* pParam)
{
	MS580314BA ms580314ba;
	struct timeval tv;
	double pressure = 0, pressure_prev = 0, filteredpressure = 0;
	CHRONO chrono_filter;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&ms580314ba, 0, sizeof(MS580314BA));

	StartChrono(&chrono_filter);

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseMS580314BA)
		{
			if (bConnected)
			{
				printf("MS580314BA Paused.\n");
				bConnected = FALSE;
				DisconnectMS580314BA(&ms580314ba);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartMS580314BA)
		{
			if (bConnected)
			{
				printf("Restarting a MS580314BA.\n");
				bConnected = FALSE;
				DisconnectMS580314BA(&ms580314ba);
			}
			bRestartMS580314BA = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectMS580314BA(&ms580314ba, "MS580314BA0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = ms580314ba.threadperiod;

				StopChronoQuick(&chrono_filter);
				StartChrono(&chrono_filter);

				if (ms580314ba.pfSaveFile != NULL)
				{
					fclose(ms580314ba.pfSaveFile); 
					ms580314ba.pfSaveFile = NULL;
				}
				if ((ms580314ba.bSaveRawData)&&(ms580314ba.pfSaveFile == NULL)) 
				{
					if (strlen(ms580314ba.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", ms580314ba.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "ms580314ba");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					ms580314ba.pfSaveFile = fopen(szSaveFilePath, "w");
					if (ms580314ba.pfSaveFile == NULL) 
					{
						printf("Unable to create MS580314BA data file.\n");
						break;
					}
					fprintf(ms580314ba.pfSaveFile, "tv_sec;tv_usec;pressure;\n"); 
					fflush(ms580314ba.pfSaveFile);
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetPressureMS580314BA(&ms580314ba, &pressure) == EXIT_SUCCESS)
			{
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				EnterCriticalSection(&StateVariablesCS);
				pressure_mes = pressure;
				if ((GetTimeElapsedChronoQuick(&chrono_filter) > 2)&&(GetTimeElapsedChronoQuick(&chrono_filter) <= 3))
				{
					pressure_prev = pressure; // Initialization of pressure_prev...
				}
				if (GetTimeElapsedChronoQuick(&chrono_filter) > 3)
				{
					if (fabs(pressure-pressure_prev) < 0.05)
					{
						filteredpressure = pressure;
						pressure_prev = filteredpressure;
					}
					else
					{
						// Ignore outlier...
						filteredpressure = pressure_prev;
					}
				}
				else
				{
					filteredpressure = pressure;
				}
				z_pressure = Pressure2Height(filteredpressure, ms580314ba.PressureRef, ms580314ba.WaterDensity)+interval(-z_pressure_acc, z_pressure_acc);
				LeaveCriticalSection(&StateVariablesCS);

				if (ms580314ba.bSaveRawData)
				{
					fprintf(ms580314ba.pfSaveFile, "%d;%d;%f;\n", (int)tv.tv_sec, (int)tv.tv_usec, pressure);
					fflush(ms580314ba.pfSaveFile);
				}
			}
			else
			{
				printf("Connection to a MS580314BA lost.\n");
				bConnected = FALSE;
				DisconnectMS580314BA(&ms580314ba);
			}		
		}

		//printf("MS580314BAThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	StopChronoQuick(&chrono_filter);

	if (ms580314ba.pfSaveFile != NULL)
	{
		fclose(ms580314ba.pfSaveFile); 
		ms580314ba.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectMS580314BA(&ms580314ba);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}